

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  basic_appender<char> bVar1;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_28;
  
  local_28.num_digits = count_digits<4,unsigned_long>(value);
  local_28.value = value;
  if (specs == (format_specs *)0x0) {
    bVar1 = reserve<char>(out,(ulong)(uint)local_28.num_digits + 2);
    bVar1 = write_ptr<char,_fmt::v11::basic_appender<char>,_unsigned_long>::anon_class_16_2_92d121e5
            ::operator()(&local_28,bVar1.container);
  }
  else {
    bVar1 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,(ulong)(uint)local_28.num_digits + 2,&local_28);
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}